

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

NewCovergroupExpression * __thiscall
slang::BumpAllocator::
emplace<slang::ast::NewCovergroupExpression,slang::ast::Type_const&,std::span<slang::ast::Expression_const*,18446744073709551615ul>,slang::SourceRange&>
          (BumpAllocator *this,Type *args,
          span<const_slang::ast::Expression_*,_18446744073709551615UL> *args_1,SourceRange *args_2)

{
  SourceRange sourceRange;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> arguments;
  Type *type;
  __extent_storage<18446744073709551615UL> in_RCX;
  size_t in_stack_ffffffffffffffb8;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *in_stack_ffffffffffffffc0;
  BumpAllocator *in_stack_ffffffffffffffc8;
  SourceLocation in_stack_ffffffffffffffd0;
  pointer in_stack_ffffffffffffffd8;
  
  type = (Type *)allocate(in_stack_ffffffffffffffc8,(size_t)in_stack_ffffffffffffffc0,
                          in_stack_ffffffffffffffb8);
  std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::
  span<const_slang::ast::Expression_*,_18446744073709551615UL>
            (in_stack_ffffffffffffffc0,
             (span<const_slang::ast::Expression_*,_18446744073709551615UL> *)type);
  arguments._M_extent._M_extent_value = in_RCX._M_extent_value;
  arguments._M_ptr = in_stack_ffffffffffffffd8;
  sourceRange.endLoc = in_stack_ffffffffffffffd0;
  sourceRange.startLoc = *(SourceLocation *)(in_RCX._M_extent_value + 8);
  ast::NewCovergroupExpression::NewCovergroupExpression
            (*(NewCovergroupExpression **)in_RCX._M_extent_value,type,arguments,sourceRange);
  return (NewCovergroupExpression *)type;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }